

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_dns_encode_name(mbuf *io,char *name,size_t len)

{
  size_t sVar1;
  size_t pos;
  char *pcStack_30;
  uchar n;
  char *s;
  size_t len_local;
  char *name_local;
  mbuf *io_local;
  
  sVar1 = io->len;
  s = (char *)len;
  len_local = (size_t)name;
  name_local = (char *)io;
  do {
    pcStack_30 = strchr((char *)len_local,0x2e);
    if (pcStack_30 == (char *)0x0) {
      pcStack_30 = s + len_local;
    }
    if (0x7f < (long)((long)pcStack_30 - len_local)) {
      return -1;
    }
    pos._7_1_ = (char)pcStack_30 - (char)len_local;
    mbuf_append((mbuf *)name_local,(void *)((long)&pos + 7),1);
    mbuf_append((mbuf *)name_local,(void *)len_local,(ulong)pos._7_1_);
    if (*pcStack_30 == '.') {
      pos._7_1_ = pos._7_1_ + 1;
    }
    len_local = len_local + (long)(int)(uint)pos._7_1_;
    s = s + -(ulong)pos._7_1_;
  } while (*pcStack_30 != '\0');
  mbuf_append((mbuf *)name_local,"",1);
  return (int)*(undefined8 *)(name_local + 8) - (int)sVar1;
}

Assistant:

static int mg_dns_encode_name(struct mbuf *io, const char *name, size_t len) {
    const char *s;
    unsigned char n;
    size_t pos = io->len;

    do {
        if ((s = strchr(name, '.')) == NULL) {
            s = name + len;
        }

        if (s - name > 127) {
            return -1; /* TODO(mkm) cover */
        }
        n = s - name;           /* chunk length */
        mbuf_append(io, &n, 1); /* send length */
        mbuf_append(io, name, n);

        if (*s == '.') {
            n++;
        }

        name += n;
        len -= n;
    } while (*s != '\0');
    mbuf_append(io, "\0", 1); /* Mark end of host name */

    return io->len - pos;
}